

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool absl::lts_20250127::EndsWith(string_view text,string_view suffix)

{
  bool bVar1;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view text_local;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  uVar2 = suffix._M_len;
  if (uVar2 == 0) {
    bVar1 = true;
  }
  else if (text_local._M_len < uVar2) {
    bVar1 = false;
  }
  else {
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&text_local,text_local._M_len - uVar2,0xffffffffffffffff);
    bVar1 = std::operator==(__x,suffix);
  }
  return bVar1;
}

Assistant:

inline constexpr bool EndsWith(absl::string_view text,
                               absl::string_view suffix) noexcept {
  if (suffix.empty()) {
    return true;
  }
  if (text.size() < suffix.size()) {
    return false;
  }
  absl::string_view possible_match = text.substr(text.size() - suffix.size());
  return possible_match == suffix;
}